

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

void CMU462::Collada::ColladaParser::parse_material(XMLElement *xml,MaterialInfo *material)

{
  double dVar1;
  bool bVar2;
  char *pcVar3;
  XMLElement *pXVar4;
  void *pvVar5;
  DiffuseBSDF *this;
  Spectrum *a;
  undefined4 *in_RSI;
  Spectrum SVar6;
  BSDF *bsdf_4;
  Spectrum albedo;
  XMLElement *e_diffuse;
  BSDF *bsdf_3;
  float ior_1;
  float roughness_1;
  Spectrum reflectance_1;
  Spectrum transmittance_1;
  XMLElement *e_ior_1;
  XMLElement *e_roughness_1;
  XMLElement *e_reflectance_1;
  XMLElement *e_transmittance_1;
  BSDF *bsdf_2;
  float ior;
  float roughness;
  Spectrum transmittance;
  XMLElement *e_ior;
  XMLElement *e_roughness;
  XMLElement *e_transmittance;
  BSDF *bsdf_1;
  Spectrum reflectance;
  XMLElement *e_reflectance;
  BSDF *bsdf;
  Spectrum radiance;
  XMLElement *e_radiance;
  string type;
  XMLElement *e_bsdf;
  XMLElement *tech_cmu462;
  XMLElement *tech_common;
  XMLElement *e_effect;
  XMLElement *in_stack_fffffffffffff908;
  XMLNode *in_stack_fffffffffffff910;
  XMLElement *in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff924;
  XMLElement *in_stack_fffffffffffff968;
  XMLElement *in_stack_fffffffffffff9a8;
  XMLElement *in_stack_fffffffffffffac0;
  XMLElement *in_stack_fffffffffffffb68;
  XMLElement *in_stack_fffffffffffffb70;
  Spectrum local_44c [2];
  Spectrum local_434;
  undefined8 local_428;
  float local_420;
  allocator local_411;
  string local_410 [32];
  undefined8 local_3f0;
  float local_3e8;
  allocator local_3e1;
  string local_3e0 [32];
  XMLElement *local_3c0;
  void *local_3b8;
  float local_3b0;
  float local_3ac;
  undefined8 local_3a8;
  float local_3a0;
  allocator local_391;
  string local_390 [32];
  undefined8 local_370;
  float local_368;
  undefined8 local_360;
  float local_358;
  allocator local_349;
  string local_348 [32];
  undefined8 local_328;
  float local_320;
  allocator local_319;
  string local_318 [32];
  XMLElement *local_2f8;
  allocator local_2e9;
  string local_2e8 [32];
  XMLElement *local_2c8;
  allocator local_2b9;
  string local_2b8 [32];
  XMLElement *local_298;
  allocator local_289;
  string local_288 [32];
  XMLElement *local_268;
  void *local_260;
  float local_258;
  float local_254;
  undefined8 local_250;
  float local_248;
  allocator local_239;
  string local_238 [32];
  undefined8 local_218;
  float local_210;
  allocator local_209;
  string local_208 [32];
  XMLElement *local_1e8;
  allocator local_1d9;
  string local_1d8 [32];
  XMLElement *local_1b8;
  allocator local_1a9;
  string local_1a8 [32];
  XMLElement *local_188;
  void *local_180;
  undefined8 local_178;
  float local_170;
  allocator local_161;
  string local_160 [32];
  undefined8 local_140;
  float local_138;
  allocator local_131;
  string local_130 [32];
  XMLElement *local_110;
  void *local_108;
  undefined8 local_100;
  float local_f8;
  allocator local_e9;
  string local_e8 [32];
  undefined8 local_c8;
  float local_c0;
  undefined1 local_b9 [33];
  XMLElement *local_98;
  allocator local_89;
  string local_88 [32];
  XMLElement *local_68;
  XMLElement *local_60;
  XMLElement *local_58;
  allocator local_39;
  string local_38 [32];
  XMLElement *local_18;
  undefined4 *local_10;
  
  local_10 = in_RSI;
  pcVar3 = tinyxml2::XMLElement::Attribute
                     (in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910,
                      (char *)in_stack_fffffffffffff908);
  std::__cxx11::string::operator=((string *)(local_10 + 2),pcVar3);
  pcVar3 = tinyxml2::XMLElement::Attribute
                     (in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910,
                      (char *)in_stack_fffffffffffff908);
  std::__cxx11::string::operator=((string *)(local_10 + 10),pcVar3);
  *local_10 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"instance_effect",&local_39);
  pXVar4 = get_element(in_stack_fffffffffffffb70,(string *)in_stack_fffffffffffffb68);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pXVar4;
  if (pXVar4 == (XMLElement *)0x0) {
    exit(1);
  }
  local_58 = get_technique_common(in_stack_fffffffffffff968);
  local_60 = get_technique_cmu462(in_stack_fffffffffffff9a8);
  if (local_60 == (XMLElement *)0x0) {
    if (local_58 == (XMLElement *)0x0) {
      a = (Spectrum *)operator_new(0x28);
      Spectrum::Spectrum(local_44c,0.5,0.5,0.5);
      DiffuseBSDF::DiffuseBSDF((DiffuseBSDF *)in_stack_fffffffffffff910,a);
      *(Spectrum **)(local_10 + 0x12) = a;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3e0,"phong/diffuse/color",&local_3e1);
      pXVar4 = get_element(in_stack_fffffffffffffb70,(string *)in_stack_fffffffffffffb68);
      std::__cxx11::string::~string(local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
      local_3c0 = pXVar4;
      if (pXVar4 == (XMLElement *)0x0) {
        this = (DiffuseBSDF *)operator_new(0x28);
        Spectrum::Spectrum(&local_434,0.5,0.5,0.5);
        DiffuseBSDF::DiffuseBSDF(this,(Spectrum *)in_stack_fffffffffffff908);
        *(DiffuseBSDF **)(local_10 + 0x12) = this;
      }
      else {
        pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff908);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_410,pcVar3,&local_411);
        SVar6 = spectrum_from_string((string *)in_stack_fffffffffffffac0);
        local_420 = SVar6.b;
        local_428 = SVar6._0_8_;
        local_3f0 = local_428;
        local_3e8 = local_420;
        std::__cxx11::string::~string(local_410);
        std::allocator<char>::~allocator((allocator<char> *)&local_411);
        pvVar5 = operator_new(0x28);
        DiffuseBSDF::DiffuseBSDF
                  ((DiffuseBSDF *)in_stack_fffffffffffff910,(Spectrum *)in_stack_fffffffffffff908);
        *(void **)(local_10 + 0x12) = pvVar5;
      }
    }
  }
  else {
    local_68 = tinyxml2::XMLNode::FirstChildElement
                         (in_stack_fffffffffffff910,(char *)in_stack_fffffffffffff908);
    while (local_68 != (XMLElement *)0x0) {
      pcVar3 = tinyxml2::XMLElement::Name((XMLElement *)0x1f1de2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,pcVar3,&local_89);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff910,(char *)in_stack_fffffffffffff908);
      if (bVar2) {
        in_stack_fffffffffffffb70 = (XMLElement *)local_b9;
        in_stack_fffffffffffffb68 = local_68;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_b9 + 1),"radiance",(allocator *)in_stack_fffffffffffffb70);
        pXVar4 = get_element(in_stack_fffffffffffffb70,(string *)in_stack_fffffffffffffb68);
        std::__cxx11::string::~string((string *)(local_b9 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_b9);
        local_98 = pXVar4;
        pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff908);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e8,pcVar3,&local_e9);
        SVar6 = spectrum_from_string((string *)in_stack_fffffffffffffac0);
        local_f8 = SVar6.b;
        local_100 = SVar6._0_8_;
        local_c8 = local_100;
        local_c0 = local_f8;
        std::__cxx11::string::~string(local_e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_e9);
        pvVar5 = operator_new(0x28);
        EmissionBSDF::EmissionBSDF
                  ((EmissionBSDF *)in_stack_fffffffffffff910,(Spectrum *)in_stack_fffffffffffff908);
        *(void **)(local_10 + 0x12) = pvVar5;
        local_108 = pvVar5;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff910,(char *)in_stack_fffffffffffff908);
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_130,"reflectance",&local_131);
          pXVar4 = get_element(in_stack_fffffffffffffb70,(string *)in_stack_fffffffffffffb68);
          std::__cxx11::string::~string(local_130);
          std::allocator<char>::~allocator((allocator<char> *)&local_131);
          local_110 = pXVar4;
          pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff908);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_160,pcVar3,&local_161);
          SVar6 = spectrum_from_string((string *)in_stack_fffffffffffffac0);
          local_170 = SVar6.b;
          local_178 = SVar6._0_8_;
          local_140 = local_178;
          local_138 = local_170;
          std::__cxx11::string::~string(local_160);
          std::allocator<char>::~allocator((allocator<char> *)&local_161);
          pvVar5 = operator_new(0x28);
          MirrorBSDF::MirrorBSDF
                    ((MirrorBSDF *)in_stack_fffffffffffff910,(Spectrum *)in_stack_fffffffffffff908);
          *(void **)(local_10 + 0x12) = pvVar5;
          local_180 = pvVar5;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff910,(char *)in_stack_fffffffffffff908);
          if (bVar2) {
            in_stack_fffffffffffffac0 = local_68;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1a8,"transmittance",&local_1a9);
            pXVar4 = get_element(in_stack_fffffffffffffb70,(string *)in_stack_fffffffffffffb68);
            std::__cxx11::string::~string(local_1a8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
            local_188 = pXVar4;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1d8,"roughness",&local_1d9);
            pXVar4 = get_element(in_stack_fffffffffffffb70,(string *)in_stack_fffffffffffffb68);
            std::__cxx11::string::~string(local_1d8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
            local_1b8 = pXVar4;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_208,"ior",&local_209);
            pXVar4 = get_element(in_stack_fffffffffffffb70,(string *)in_stack_fffffffffffffb68);
            std::__cxx11::string::~string(local_208);
            std::allocator<char>::~allocator((allocator<char> *)&local_209);
            local_1e8 = pXVar4;
            pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff908);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_238,pcVar3,&local_239);
            SVar6 = spectrum_from_string((string *)in_stack_fffffffffffffac0);
            local_248 = SVar6.b;
            local_250 = SVar6._0_8_;
            local_218 = local_250;
            local_210 = local_248;
            std::__cxx11::string::~string(local_238);
            std::allocator<char>::~allocator((allocator<char> *)&local_239);
            pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff908);
            dVar1 = atof(pcVar3);
            local_254 = (float)dVar1;
            pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff908);
            dVar1 = atof(pcVar3);
            local_258 = (float)dVar1;
            pvVar5 = operator_new(0x28);
            RefractionBSDF::RefractionBSDF
                      ((RefractionBSDF *)
                       CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                       (Spectrum *)in_stack_fffffffffffff918,
                       (float)((ulong)in_stack_fffffffffffff910 >> 0x20),
                       SUB84(in_stack_fffffffffffff910,0));
            *(void **)(local_10 + 0x12) = pvVar5;
            local_260 = pvVar5;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff910,(char *)in_stack_fffffffffffff908);
            if (bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_288,"transmittance",&local_289);
              pXVar4 = get_element(in_stack_fffffffffffffb70,(string *)in_stack_fffffffffffffb68);
              std::__cxx11::string::~string(local_288);
              std::allocator<char>::~allocator((allocator<char> *)&local_289);
              local_268 = pXVar4;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2b8,"reflectance",&local_2b9);
              pXVar4 = get_element(in_stack_fffffffffffffb70,(string *)in_stack_fffffffffffffb68);
              std::__cxx11::string::~string(local_2b8);
              std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
              local_298 = pXVar4;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2e8,"roughness",&local_2e9);
              pXVar4 = get_element(in_stack_fffffffffffffb70,(string *)in_stack_fffffffffffffb68);
              std::__cxx11::string::~string(local_2e8);
              std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
              local_2c8 = pXVar4;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_318,"ior",&local_319);
              pXVar4 = get_element(in_stack_fffffffffffffb70,(string *)in_stack_fffffffffffffb68);
              std::__cxx11::string::~string(local_318);
              std::allocator<char>::~allocator((allocator<char> *)&local_319);
              local_2f8 = pXVar4;
              pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff908);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_348,pcVar3,&local_349);
              SVar6 = spectrum_from_string((string *)in_stack_fffffffffffffac0);
              local_358 = SVar6.b;
              local_360 = SVar6._0_8_;
              local_328 = local_360;
              local_320 = local_358;
              std::__cxx11::string::~string(local_348);
              std::allocator<char>::~allocator((allocator<char> *)&local_349);
              pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff908);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_390,pcVar3,&local_391);
              SVar6 = spectrum_from_string((string *)in_stack_fffffffffffffac0);
              local_3a0 = SVar6.b;
              local_3a8 = SVar6._0_8_;
              local_370 = local_3a8;
              local_368 = local_3a0;
              std::__cxx11::string::~string(local_390);
              std::allocator<char>::~allocator((allocator<char> *)&local_391);
              pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff908);
              dVar1 = atof(pcVar3);
              local_3ac = (float)dVar1;
              pcVar3 = tinyxml2::XMLElement::GetText(in_stack_fffffffffffff908);
              dVar1 = atof(pcVar3);
              local_3b0 = (float)dVar1;
              pvVar5 = operator_new(0x38);
              GlassBSDF::GlassBSDF
                        ((GlassBSDF *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                         (Spectrum *)in_stack_fffffffffffff918,(Spectrum *)in_stack_fffffffffffff910
                         ,(float)((ulong)in_stack_fffffffffffff908 >> 0x20),
                         SUB84(in_stack_fffffffffffff908,0));
              *(void **)(local_10 + 0x12) = pvVar5;
              local_3b8 = pvVar5;
            }
          }
        }
      }
      local_68 = tinyxml2::XMLNode::NextSiblingElement
                           (in_stack_fffffffffffff910,(char *)in_stack_fffffffffffff908);
      std::__cxx11::string::~string(local_88);
    }
  }
  return;
}

Assistant:

void ColladaParser::parse_material(XMLElement* xml, MaterialInfo& material) {
  // name & id
  material.id = xml->Attribute("id");
  material.name = xml->Attribute("name");
  material.type = Instance::MATERIAL;

  // parse effect
  XMLElement* e_effect = get_element(xml, "instance_effect");
  if (e_effect) {
    // if the material does not have additional specification in the 462
    // profile. The diffuse color will be used to create a diffuse BSDF,
    // Other information from the common profile are ignored

    XMLElement* tech_common = get_technique_common(e_effect);  // common profile
    XMLElement* tech_cmu462 = get_technique_cmu462(e_effect);  // cmu462 profile

    if (tech_cmu462) {
      XMLElement* e_bsdf = tech_cmu462->FirstChildElement();
      while (e_bsdf) {
        string type = e_bsdf->Name();
        if (type == "emission") {
          XMLElement* e_radiance = get_element(e_bsdf, "radiance");
          Spectrum radiance =
              spectrum_from_string(string(e_radiance->GetText()));
          BSDF* bsdf = new EmissionBSDF(radiance);
          material.bsdf = bsdf;
        } else if (type == "mirror") {
          XMLElement* e_reflectance = get_element(e_bsdf, "reflectance");
          Spectrum reflectance =
              spectrum_from_string(string(e_reflectance->GetText()));
          BSDF* bsdf = new MirrorBSDF(reflectance);
          material.bsdf = bsdf;
          /*
          if (type == "glossy") {
            XMLElement *e_reflectance  = get_element(e_bsdf, "reflectance");
            XMLElement *e_roughness = get_element(e_bsdf, "roughness");
            Spectrum reflectance =
          spectrum_from_string(string(e_reflectance->GetText()));
            float roughness = atof(e_roughness->GetText());
            BSDF* bsdf = new GlossyBSDF(reflectance, roughness);
            material.bsdf = bsdf;
          */
        } else if (type == "refraction") {
          XMLElement* e_transmittance = get_element(e_bsdf, "transmittance");
          XMLElement* e_roughness = get_element(e_bsdf, "roughness");
          XMLElement* e_ior = get_element(e_bsdf, "ior");
          Spectrum transmittance =
              spectrum_from_string(string(e_transmittance->GetText()));
          float roughness = atof(e_roughness->GetText());
          float ior = atof(e_ior->GetText());
          BSDF* bsdf = new RefractionBSDF(transmittance, roughness, ior);
          material.bsdf = bsdf;
        } else if (type == "glass") {
          XMLElement* e_transmittance = get_element(e_bsdf, "transmittance");
          XMLElement* e_reflectance = get_element(e_bsdf, "reflectance");
          XMLElement* e_roughness = get_element(e_bsdf, "roughness");
          XMLElement* e_ior = get_element(e_bsdf, "ior");
          Spectrum transmittance =
              spectrum_from_string(string(e_transmittance->GetText()));
          Spectrum reflectance =
              spectrum_from_string(string(e_reflectance->GetText()));
          float roughness = atof(e_roughness->GetText());
          float ior = atof(e_ior->GetText());
          BSDF* bsdf =
              new GlassBSDF(transmittance, reflectance, roughness, ior);
          material.bsdf = bsdf;
        }

        e_bsdf = e_bsdf->NextSiblingElement();
      }
    } else if (tech_common) {
      XMLElement* e_diffuse = get_element(tech_common, "phong/diffuse/color");
      if (e_diffuse) {
        Spectrum albedo = spectrum_from_string(string(e_diffuse->GetText()));
        material.bsdf = new DiffuseBSDF(albedo);
      } else {
        material.bsdf = new DiffuseBSDF(Spectrum(.5f, .5f, .5f));
      }
    } else {
      BSDF* bsdf = new DiffuseBSDF(Spectrum(.5f, .5f, .5f));
      material.bsdf = bsdf;
    }
  } else {
    stat("Error: no target effects found for material: " << material.id);
    exit(EXIT_FAILURE);
  }

  // print summary
  stat("  |- " << material);
}